

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_set_engine(Curl_easy *data,char *name)

{
  ENGINE *e;
  int iVar1;
  CURLcode CVar2;
  ENGINE *e_00;
  ulong error;
  char *pcVar3;
  char buf [256];
  
  e_00 = ENGINE_by_id(name);
  if (e_00 != (ENGINE *)0x0) {
    e = (ENGINE *)(data->state).engine;
    if (e != (ENGINE *)0x0) {
      ENGINE_finish(e);
      ENGINE_free((ENGINE *)(data->state).engine);
      (data->state).engine = (void *)0x0;
    }
    iVar1 = ENGINE_init(e_00);
    if (iVar1 == 0) {
      ENGINE_free(e_00);
      error = ERR_get_error();
      pcVar3 = ossl_strerror(error,buf,0x100);
      e_00 = (ENGINE *)0x0;
      Curl_failf(data,"Failed to initialise SSL Engine \'%s\': %s",name,pcVar3);
      CVar2 = CURLE_SSL_ENGINE_INITFAILED;
    }
    else {
      CVar2 = CURLE_SSL_ENGINE_NOTFOUND;
    }
    (data->state).engine = e_00;
    return CVar2;
  }
  CVar2 = ossl_set_provider(data,name);
  return CVar2;
}

Assistant:

static CURLcode ossl_set_engine(struct Curl_easy *data, const char *name)
{
#ifdef USE_OPENSSL_ENGINE
  CURLcode result = CURLE_SSL_ENGINE_NOTFOUND;
  ENGINE *e = ENGINE_by_id(name);

  if(e) {

    if(data->state.engine) {
      ENGINE_finish(data->state.engine);
      ENGINE_free(data->state.engine);
      data->state.engine = NULL;
    }
    if(!ENGINE_init(e)) {
      char buf[256];

      ENGINE_free(e);
      failf(data, "Failed to initialise SSL Engine '%s': %s",
            name, ossl_strerror(ERR_get_error(), buf, sizeof(buf)));
      result = CURLE_SSL_ENGINE_INITFAILED;
      e = NULL;
    }
    data->state.engine = e;
    return result;
  }
#endif
#ifdef OPENSSL_HAS_PROVIDERS
  return ossl_set_provider(data, name);
#else
  (void)name;
  failf(data, "OpenSSL engine not found");
  return CURLE_SSL_ENGINE_NOTFOUND;
#endif
}